

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::IsMap
          (ProtoStreamObjectWriter *this,Field *field)

{
  string *psVar1;
  size_t size;
  TypeInfo *pTVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  
  psVar1 = (field->type_url_).ptr_;
  size = psVar1->_M_string_length;
  if (((size != 0) && (field->kind_ == 0xb)) && (field->cardinality_ == 3)) {
    pTVar2 = (this->super_ProtoWriter).typeinfo_;
    pcVar3 = (psVar1->_M_dataplus)._M_p;
    if ((long)size < 0) {
      StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
    }
    iVar5 = (*pTVar2->_vptr_TypeInfo[3])(pTVar2,pcVar3,size);
    bVar4 = converter::IsMap(field,(Type *)CONCAT44(extraout_var,iVar5));
    return bVar4;
  }
  return false;
}

Assistant:

bool ProtoStreamObjectWriter::IsMap(const google::protobuf::Field& field) {
  if (field.type_url().empty() ||
      field.kind() != google::protobuf::Field::TYPE_MESSAGE ||
      field.cardinality() != google::protobuf::Field::CARDINALITY_REPEATED) {
    return false;
  }
  const google::protobuf::Type* field_type =
      typeinfo()->GetTypeByTypeUrl(field.type_url());

  return converter::IsMap(field, *field_type);
}